

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::orthonormalize_basis(double3 *tx,double3 *ty,double3 *tz,bool normalize,double eps)

{
  undefined3 in_register_00000009;
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double3 local_148;
  double local_130;
  double3 local_128;
  double3 local_108;
  double3 local_f0;
  double3 local_d8;
  double local_b8;
  double local_b0;
  double3 local_a8;
  double3 local_88;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_130 = eps;
  if (CONCAT31(in_register_00000009,normalize) == 0) {
    vnormalize(&local_148,tx,2.220446049250313e-16);
    vnormalize(&local_108,ty,2.220446049250313e-16);
    vnormalize(&local_128,tz,2.220446049250313e-16);
  }
  else {
    vnormalize(&local_148,tx,2.220446049250313e-16);
    tx->_M_elems[2] = local_148._M_elems[2];
    tx->_M_elems[0] = local_148._M_elems[0];
    tx->_M_elems[1] = local_148._M_elems[1];
    vnormalize(&local_148,ty,2.220446049250313e-16);
    ty->_M_elems[2] = local_148._M_elems[2];
    ty->_M_elems[0] = local_148._M_elems[0];
    ty->_M_elems[1] = local_148._M_elems[1];
    vnormalize(&local_148,tz,2.220446049250313e-16);
    tz->_M_elems[2] = local_148._M_elems[2];
    tz->_M_elems[0] = local_148._M_elems[0];
    tz->_M_elems[1] = local_148._M_elems[1];
    local_148._M_elems[2] = tx->_M_elems[2];
    local_148._M_elems[0] = tx->_M_elems[0];
    local_148._M_elems[1] = tx->_M_elems[1];
    local_108._M_elems[0] = ty->_M_elems[0];
    local_108._M_elems[1] = ty->_M_elems[1];
    local_108._M_elems[2] = ty->_M_elems[2];
    local_128._M_elems[0] = tz->_M_elems[0];
    local_128._M_elems[1] = tz->_M_elems[1];
    local_128._M_elems[2] = tz->_M_elems[2];
  }
  if (ABS(local_148._M_elems[0] - local_108._M_elems[0]) <= local_130) {
LAB_003cd644:
    if (local_130 < ABS(local_148._M_elems[1] - local_108._M_elems[1])) {
      dVar6 = ABS(local_148._M_elems[1]);
      dVar3 = ABS(local_108._M_elems[1]);
      dVar4 = dVar3;
      if (dVar3 <= dVar6) {
        dVar4 = dVar6;
      }
      if ((double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) *
          local_130 < ABS(local_148._M_elems[1] - local_108._M_elems[1])) goto LAB_003cd6fe;
    }
    if (ABS(local_148._M_elems[2] - local_108._M_elems[2]) <= local_130) {
      return false;
    }
    dVar6 = ABS(local_148._M_elems[2]);
    dVar3 = ABS(local_108._M_elems[2]);
    dVar4 = dVar3;
    if (dVar3 <= dVar6) {
      dVar4 = dVar6;
    }
    if (ABS(local_148._M_elems[2] - local_108._M_elems[2]) <=
        (double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) * local_130
       ) {
      return false;
    }
  }
  else {
    dVar6 = ABS(local_148._M_elems[0]);
    dVar3 = ABS(local_108._M_elems[0]);
    dVar4 = dVar3;
    if (dVar3 <= dVar6) {
      dVar4 = dVar6;
    }
    if (ABS(local_148._M_elems[0] - local_108._M_elems[0]) <=
        (double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) * local_130
       ) goto LAB_003cd644;
  }
LAB_003cd6fe:
  if (ABS(local_148._M_elems[0] - local_128._M_elems[0]) <= local_130) {
LAB_003cd755:
    if (local_130 < ABS(local_148._M_elems[1] - local_128._M_elems[1])) {
      dVar6 = ABS(local_148._M_elems[1]);
      dVar3 = ABS(local_128._M_elems[1]);
      dVar4 = dVar3;
      if (dVar3 <= dVar6) {
        dVar4 = dVar6;
      }
      if ((double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) *
          local_130 < ABS(local_148._M_elems[1] - local_128._M_elems[1])) goto LAB_003cd80f;
    }
    if (ABS(local_148._M_elems[2] - local_128._M_elems[2]) <= local_130) {
      return false;
    }
    dVar6 = ABS(local_148._M_elems[2]);
    dVar3 = ABS(local_128._M_elems[2]);
    dVar4 = dVar3;
    if (dVar3 <= dVar6) {
      dVar4 = dVar6;
    }
    if (ABS(local_148._M_elems[2] - local_128._M_elems[2]) <=
        (double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) * local_130
       ) {
      return false;
    }
  }
  else {
    dVar3 = ABS(local_148._M_elems[0]);
    dVar6 = ABS(local_128._M_elems[0]);
    dVar4 = dVar6;
    if (dVar6 <= dVar3) {
      dVar4 = dVar3;
    }
    if (ABS(local_148._M_elems[0] - local_128._M_elems[0]) <=
        (double)(~-(ulong)NAN(dVar3) & (ulong)dVar4 | -(ulong)NAN(dVar3) & (ulong)dVar6) * local_130
       ) goto LAB_003cd755;
  }
LAB_003cd80f:
  if (local_130 < ABS(local_108._M_elems[0] - local_128._M_elems[0])) {
    dVar4 = ABS(local_108._M_elems[0]);
    dVar6 = ABS(local_128._M_elems[0]);
    dVar3 = dVar6;
    if (dVar6 <= dVar4) {
      dVar3 = dVar4;
    }
    if ((double)(~-(ulong)NAN(dVar4) & (ulong)dVar3 | -(ulong)NAN(dVar4) & (ulong)dVar6) * local_130
        < ABS(local_108._M_elems[0] - local_128._M_elems[0])) goto LAB_003cd91a;
  }
  if (local_130 < ABS(local_108._M_elems[1] - local_128._M_elems[1])) {
    dVar6 = ABS(local_108._M_elems[1]);
    dVar3 = ABS(local_128._M_elems[1]);
    dVar4 = dVar3;
    if (dVar3 <= dVar6) {
      dVar4 = dVar6;
    }
    if ((double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) * local_130
        < ABS(local_108._M_elems[1] - local_128._M_elems[1])) goto LAB_003cd91a;
  }
  if (local_130 < ABS(local_108._M_elems[2] - local_128._M_elems[2])) {
    dVar6 = ABS(local_108._M_elems[2]);
    dVar3 = ABS(local_128._M_elems[2]);
    dVar4 = dVar3;
    if (dVar3 <= dVar6) {
      dVar4 = dVar6;
    }
    if ((double)(~-(ulong)NAN(dVar6) & (ulong)dVar4 | -(ulong)NAN(dVar6) & (ulong)dVar3) * local_130
        < ABS(local_108._M_elems[2] - local_128._M_elems[2])) {
LAB_003cd91a:
      local_130 = local_130 * local_130;
      uVar1 = 0xffffffff;
      while( true ) {
        local_b8 = tx->_M_elems[0];
        local_38 = tx->_M_elems[1];
        local_b0 = tx->_M_elems[2];
        local_58 = ty->_M_elems[0];
        local_60 = ty->_M_elems[1];
        local_50 = local_108._M_elems[0];
        local_48 = local_108._M_elems[1];
        local_40 = local_108._M_elems[2];
        dVar4 = local_108._M_elems[2] * local_b0 +
                local_108._M_elems[0] * local_b8 + local_38 * local_108._M_elems[1];
        dVar9 = local_b8 - local_108._M_elems[0] * dVar4;
        dVar10 = local_38 - local_108._M_elems[1] * dVar4;
        dVar11 = local_b0 - dVar4 * local_108._M_elems[2];
        dVar6 = local_128._M_elems[2] * dVar11 +
                local_128._M_elems[0] * dVar9 + local_128._M_elems[1] * dVar10;
        local_68 = ty->_M_elems[2];
        dVar4 = local_148._M_elems[2] * local_68 +
                local_148._M_elems[0] * local_58 + local_60 * local_148._M_elems[1];
        dVar12 = local_58 - local_148._M_elems[0] * dVar4;
        dVar13 = local_60 - local_148._M_elems[1] * dVar4;
        dVar14 = local_68 - dVar4 * local_148._M_elems[2];
        dVar5 = local_128._M_elems[2] * dVar14 +
                local_128._M_elems[0] * dVar12 + local_128._M_elems[1] * dVar13;
        local_70 = tz->_M_elems[1];
        dVar4 = tz->_M_elems[0];
        dVar3 = tz->_M_elems[2];
        dVar7 = local_148._M_elems[2] * dVar3 +
                local_148._M_elems[0] * dVar4 + local_70 * local_148._M_elems[1];
        dVar2 = dVar4 - local_148._M_elems[0] * dVar7;
        dVar15 = local_70 - local_148._M_elems[1] * dVar7;
        dVar7 = dVar3 - dVar7 * local_148._M_elems[2];
        dVar8 = local_108._M_elems[2] * dVar7 +
                local_108._M_elems[0] * dVar2 + local_108._M_elems[1] * dVar15;
        local_88._M_elems[0] = ((dVar9 - local_128._M_elems[0] * dVar6) + local_b8) * 0.5;
        local_88._M_elems[1] = ((dVar10 - local_128._M_elems[1] * dVar6) + local_38) * 0.5;
        local_88._M_elems[2] = ((dVar11 - dVar6 * local_128._M_elems[2]) + local_b0) * 0.5;
        local_a8._M_elems[0] = ((dVar12 - local_128._M_elems[0] * dVar5) + local_58) * 0.5;
        local_a8._M_elems[1] = ((dVar13 - local_128._M_elems[1] * dVar5) + local_60) * 0.5;
        local_a8._M_elems[2] = ((dVar14 - dVar5 * local_128._M_elems[2]) + local_68) * 0.5;
        local_d8._M_elems[0] = ((dVar2 - local_108._M_elems[0] * dVar8) + dVar4) * 0.5;
        local_d8._M_elems[1] = ((dVar15 - local_108._M_elems[1] * dVar8) + local_70) * 0.5;
        local_d8._M_elems[2] = ((dVar7 - dVar8 * local_108._M_elems[2]) + dVar3) * 0.5;
        if (normalize) {
          vnormalize(&local_f0,&local_88,2.220446049250313e-16);
          local_88._M_elems[2] = local_f0._M_elems[2];
          local_88._M_elems[0] = local_f0._M_elems[0];
          local_88._M_elems[1] = local_f0._M_elems[1];
          vnormalize(&local_f0,&local_a8,2.220446049250313e-16);
          local_a8._M_elems[2] = local_f0._M_elems[2];
          local_a8._M_elems[0] = local_f0._M_elems[0];
          local_a8._M_elems[1] = local_f0._M_elems[1];
          vnormalize(&local_f0,&local_d8,2.220446049250313e-16);
          local_d8._M_elems[2] = local_f0._M_elems[2];
          local_d8._M_elems[0] = local_f0._M_elems[0];
          local_d8._M_elems[1] = local_f0._M_elems[1];
        }
        dVar2 = tx->_M_elems[0] - local_88._M_elems[0];
        dVar8 = tx->_M_elems[1] - local_88._M_elems[1];
        dVar3 = tx->_M_elems[2] - local_88._M_elems[2];
        dVar7 = ty->_M_elems[0] - local_a8._M_elems[0];
        dVar9 = ty->_M_elems[1] - local_a8._M_elems[1];
        dVar4 = ty->_M_elems[2] - local_a8._M_elems[2];
        dVar6 = tz->_M_elems[0] - local_d8._M_elems[0];
        dVar5 = tz->_M_elems[1] - local_d8._M_elems[1];
        dVar10 = tz->_M_elems[2] - local_d8._M_elems[2];
        local_b8 = dVar10 * dVar10 + dVar6 * dVar6 + dVar5 * dVar5 +
                   dVar4 * dVar4 + dVar7 * dVar7 + dVar9 * dVar9 +
                   dVar3 * dVar3 + dVar2 * dVar2 + dVar8 * dVar8;
        if (local_b8 < local_130) {
          return true;
        }
        tx->_M_elems[2] = local_88._M_elems[2];
        tx->_M_elems[0] = local_88._M_elems[0];
        tx->_M_elems[1] = local_88._M_elems[1];
        ty->_M_elems[2] = local_a8._M_elems[2];
        ty->_M_elems[0] = local_a8._M_elems[0];
        ty->_M_elems[1] = local_a8._M_elems[1];
        tz->_M_elems[2] = local_d8._M_elems[2];
        tz->_M_elems[0] = local_d8._M_elems[0];
        tz->_M_elems[1] = local_d8._M_elems[1];
        local_148._M_elems[2] = tx->_M_elems[2];
        local_148._M_elems[0] = tx->_M_elems[0];
        local_148._M_elems[1] = tx->_M_elems[1];
        local_108._M_elems[2] = ty->_M_elems[2];
        local_108._M_elems[0] = ty->_M_elems[0];
        local_108._M_elems[1] = ty->_M_elems[1];
        local_128._M_elems[2] = local_d8._M_elems[2];
        local_128._M_elems[0] = local_d8._M_elems[0];
        local_128._M_elems[1] = local_d8._M_elems[1];
        if (!normalize) {
          local_b0 = (double)CONCAT44(local_b0._4_4_,uVar1);
          vnormalize(&local_f0,&local_148,2.220446049250313e-16);
          local_148._M_elems[2] = local_f0._M_elems[2];
          local_148._M_elems[0] = local_f0._M_elems[0];
          local_148._M_elems[1] = local_f0._M_elems[1];
          vnormalize(&local_f0,&local_108,2.220446049250313e-16);
          local_148._M_elems[2] = local_f0._M_elems[2];
          local_148._M_elems[0] = local_f0._M_elems[0];
          local_148._M_elems[1] = local_f0._M_elems[1];
          uVar1 = local_b0._0_4_;
          vnormalize(&local_f0,&local_128,2.220446049250313e-16);
          local_148._M_elems[2] = local_f0._M_elems[2];
          local_148._M_elems[0] = local_f0._M_elems[0];
          local_148._M_elems[1] = local_f0._M_elems[1];
        }
        if (local_b8 < local_130) break;
        uVar1 = uVar1 + 1;
        if (uVar1 == 0x13) {
          return uVar1 < 0x13;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool orthonormalize_basis(value::double3 &tx, value::double3 &ty,
                          value::double3 &tz, const bool normalize,
                          const double eps) {
  value::double3 ax, bx, cx, ay, by, cy, az, bz, cz;

  if (normalize) {
    tx = vnormalize(tx);
    ty = vnormalize(ty);
    tz = vnormalize(tz);
    ax = tx;
    ay = ty;
    az = tz;
  } else {
    ax = vnormalize(tx);
    ay = vnormalize(ty);
    az = vnormalize(tz);
  }

  /* Check for colinear vectors. This is not only a quick-out: the
   * error computation below will evaluate to zero if there's no change
   * after an iteration, which can happen either because we have a good
   * solution or because the vectors are colinear.   So we have to check
   * the colinear case beforehand, or we'll get fooled in the error
   * computation.
   */
  if (math::is_close(ax, ay, eps) || math::is_close(ax, az, eps) ||
      math::is_close(ay, az, eps)) {
    return false;
  }

  constexpr int kMAX_ITERS = 20;
  int iter;
  for (iter = 0; iter < kMAX_ITERS; ++iter) {
    bx = tx;
    by = ty;
    bz = tz;

    bx = bx - vdot(ay, bx) * ay;
    bx = bx - vdot(az, bx) * az;

    by = by - vdot(ax, by) * ax;
    by = by - vdot(az, by) * az;

    bz = bz - vdot(ax, bz) * ax;
    bz = bz - vdot(ay, bz) * ay;

    cx = 0.5 * (tx + bx);
    cy = 0.5 * (ty + by);
    cz = 0.5 * (tz + bz);

    if (normalize) {
      cx = vnormalize(cx);
      cy = vnormalize(cy);
      cz = vnormalize(cz);
    }

    value::double3 xDiff = tx - cx;
    value::double3 yDiff = ty - cy;
    value::double3 zDiff = tz - cz;

    double error = vdot(xDiff, xDiff) + vdot(yDiff, yDiff) + vdot(zDiff, zDiff);

    // error is squared, so compare to squared tolerance
    if (error < (eps * eps)) {
      break;
    }

    tx = cx;
    ty = cy;
    tz = cz;

    ax = tx;
    ay = ty;
    az = tz;

    if (!normalize) {
      ax = vnormalize(ax);
      ax = vnormalize(ay);
      ax = vnormalize(az);
    }
  }

  return iter < kMAX_ITERS;
}